

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Record_Query_R_PDU::Record_Query_R_PDU(Record_Query_R_PDU *this)

{
  Record_Query_R_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Record_Query_R_PDU_0032dcd0;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Record_Query_R_PDU_0032dd10;
  this->m_ui32RqId = 0;
  this->m_ui16EvntTyp = 0;
  this->m_ui32Time = 0;
  this->m_ui32NumRecs = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_vui32RecID);
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = 'A';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\n';
  return;
}

Assistant:

Record_Query_R_PDU::Record_Query_R_PDU() :
    m_ui32RqId( 0 ),
    m_ui16EvntTyp( 0 ),
    m_ui32Time( 0 ),
    m_ui32NumRecs( 0 )
{
    m_ui8PDUType = RecordQuery_R_PDU_Type;
    m_ui16PDULength = RECORD_QUERY_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}